

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O0

bool Json::parseFromStream(Factory *fact,istream *sin,Value *root,string *errs)

{
  int iVar1;
  streambuf *psVar2;
  long lVar3;
  pointer pCVar4;
  undefined8 in_RCX;
  undefined8 in_RDX;
  long *in_RDI;
  CharReaderPtr reader;
  char *end;
  char *begin;
  string doc;
  ostringstream ssin;
  pointer in_stack_fffffffffffffde8;
  unique_ptr<Json::CharReader,_std::default_delete<Json::CharReader>_> *this;
  unique_ptr<Json::CharReader,_std::default_delete<Json::CharReader>_> local_1e0;
  long local_1d8;
  long local_1d0;
  string local_1c8 [48];
  ostringstream local_198 [376];
  undefined8 local_20;
  undefined8 local_18;
  long *local_8;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_8 = in_RDI;
  std::__cxx11::ostringstream::ostringstream(local_198);
  psVar2 = (streambuf *)std::ios::rdbuf();
  std::ostream::operator<<(local_198,psVar2);
  std::__cxx11::ostringstream::str();
  lVar3 = std::__cxx11::string::data();
  local_1d0 = lVar3;
  local_1d8 = std::__cxx11::string::size();
  local_1d8 = lVar3 + local_1d8;
  (**(code **)(*local_8 + 0x10))();
  this = &local_1e0;
  std::unique_ptr<Json::CharReader,std::default_delete<Json::CharReader>>::
  unique_ptr<std::default_delete<Json::CharReader>,void>(this,in_stack_fffffffffffffde8);
  pCVar4 = std::unique_ptr<Json::CharReader,_std::default_delete<Json::CharReader>_>::operator->
                     ((unique_ptr<Json::CharReader,_std::default_delete<Json::CharReader>_> *)
                      0x2cd2c8);
  iVar1 = (*pCVar4->_vptr_CharReader[2])(pCVar4,local_1d0,local_1d8,local_18,local_20);
  std::unique_ptr<Json::CharReader,_std::default_delete<Json::CharReader>_>::~unique_ptr(this);
  std::__cxx11::string::~string(local_1c8);
  std::__cxx11::ostringstream::~ostringstream(local_198);
  return (bool)((byte)iVar1 & 1);
}

Assistant:

bool parseFromStream(
    CharReader::Factory const& fact, JSONCPP_ISTREAM& sin,
    Value* root, JSONCPP_STRING* errs)
{
  JSONCPP_OSTRINGSTREAM ssin;
  ssin << sin.rdbuf();
  JSONCPP_STRING doc = ssin.str();
  char const* begin = doc.data();
  char const* end = begin + doc.size();
  // Note that we do not actually need a null-terminator.
  CharReaderPtr const reader(fact.newCharReader());
  return reader->parse(begin, end, root, errs);
}